

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O1

void __thiscall
libDAI::RegionGraph::RegionGraph
          (RegionGraph *this,FactorGraph *fg,
          vector<libDAI::Region,_std::allocator<libDAI::Region>_> *ors,
          vector<libDAI::Region,_std::allocator<libDAI::Region>_> *irs,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *edges)

{
  BipRegGraph *this_00;
  _Rb_tree_header *p_Var1;
  vector<libDAI::Region,_std::allocator<libDAI::Region>_> *this_01;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *this_02;
  pointer *pppVar2;
  iterator __position;
  bool bVar3;
  mapped_type_conflict *pmVar4;
  pointer pFVar5;
  long lVar6;
  pointer pRVar7;
  pointer __args;
  mapped_type_conflict mVar8;
  undefined1 auVar9 [64];
  FRegion local_a8;
  TFactor<double> local_68;
  
  (this->super_GraphicalModel)._normType = NORMPROB;
  (this->super_GraphicalModel)._vptr_GraphicalModel = (_func_int **)&PTR__RegionGraph_005e8030;
  FactorGraph::FactorGraph(&this->_fg,fg);
  this_00 = &this->_rg;
  p_Var1 = &(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header;
  auVar9 = ZEXT1664(ZEXT816(0) << 0x40);
  *(undefined1 (*) [64])
   &(this->_rg)._nb2.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar9;
  *(undefined1 (*) [64])
   &(this->_rg)._E12.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar9;
  (this->_rg)._V1 = (vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>)auVar9._0_24_;
  (this->_rg)._V2 = (vector<libDAI::Region,_std::allocator<libDAI::Region>_>)auVar9._24_24_;
  (this->_rg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar9._48_8_;
  (this->_rg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar9._56_8_;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
            (&this_00->_V1,
             ((long)(ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pRVar7 = (ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar7 != (ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      TFactor<double>::TFactor(&local_68,&pRVar7->super_VarSet,1.0);
      TFactor<double>::TFactor(&local_a8.super_Factor,&local_68);
      local_a8._c = 1.0;
      std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::emplace_back<libDAI::FRegion>
                (&this_00->_V1,&local_a8);
      if (local_a8.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super_Factor._p._p.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super_Factor._p._p.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super_Factor._p._p.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super_Factor._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super_Factor._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super_Factor._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != (ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_a8.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((this->_fg)._fg._V2.
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      (this->_fg)._fg._V2.
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    do {
      pFVar5 = (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
          _M_impl.super__Vector_impl_data._M_finish != pFVar5) {
        lVar6 = 0;
        mVar8 = 0;
        do {
          bVar3 = VarSet::includes((VarSet *)
                                   ((long)&(pFVar5->super_Factor)._vs._vars.
                                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar6),
                                   &(this->_fg)._fg._V2.
                                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(long)local_a8.super_Factor._vs._vars.
                                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                           ._M_impl.super__Vector_impl_data._M_start]._vs);
          if (bVar3) {
            pmVar4 = std::
                     map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     ::operator[](&this->_fac2OR,(key_type *)&local_a8);
            *pmVar4 = mVar8;
            break;
          }
          mVar8 = mVar8 + 1;
          pFVar5 = (this->_rg)._V1.
                   super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x40;
        } while (mVar8 < (ulong)((long)(this->_rg)._V1.
                                       super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5 >>
                                6));
      }
      local_a8.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&(local_a8.super_Factor._vs._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                             super__Vector_impl_data._M_start)->_label + 1);
    } while (local_a8.super_Factor._vs._vars.
             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start <
             (pointer)(((long)(this->_fg)._fg._V2.
                              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_fg)._fg._V2.
                              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))
    ;
  }
  RecomputeORs(this);
  this_01 = &(this->_rg)._V2;
  std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
            (this_01,((long)(irs->
                            super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(irs->
                            super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  for (pRVar7 = (irs->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pRVar7 != (irs->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>)._M_impl.
                super__Vector_impl_data._M_finish; pRVar7 = pRVar7 + 1) {
    std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::push_back(this_01,pRVar7);
  }
  this_02 = &(this->_rg)._E12;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve(this_02,(long)(edges->
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(edges->
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 4);
  for (__args = (edges->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __args != (edges->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    __position._M_current =
         (this->_rg)._E12.
         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_rg)._E12.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)this_02,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      pppVar2 = &(this->_rg)._E12.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + 1;
    }
  }
  BipartiteGraph<libDAI::FRegion,_libDAI::Region>::Regenerate(this_00);
  Check_Counting_Numbers(this);
  return;
}

Assistant:

RegionGraph::RegionGraph(const FactorGraph & fg, const std::vector<Region> & ors, const std::vector<Region> & irs, const std::vector<R_edge_t> & edges) : GraphicalModel(), _fg(fg), _rg(), _fac2OR() {
        // Copy outer regions (giving them counting number 1.0)
        ORs().reserve( ors.size() );
        for( vector<Region>::const_iterator alpha = ors.begin(); alpha != ors.end(); alpha++ )
            ORs().push_back( FRegion(Factor(*alpha, 1.0), 1.0) );

        // For each factor, find an outer regions that subsumes that factor.
        // Then, multiply the outer region with that factor.
        for( size_t I = 0; I < _fg.nrFactors(); I++ ) {
            size_t alpha;
            for( alpha = 0; alpha < nr_ORs(); alpha++ )
                if( OR(alpha).vars() >> _fg.factor(I).vars() ) {
                    _fac2OR[I] = alpha;
                    break;
                }
            assert( alpha != nr_ORs() );
        }
        RecomputeORs();
        
        // Copy inner regions
        IRs().reserve( irs.size() );
        for( vector<Region>::const_iterator beta = irs.begin(); beta != irs.end(); beta++ )
            IRs().push_back( *beta );
        
        // Copy edges
        Redges().reserve( edges.size() );
        for( vector<R_edge_t>::const_iterator e = edges.begin(); e != edges.end(); e++ )
            Redges().push_back( *e );
        
        // Regenerate BipartiteGraph internals
        _rg.Regenerate();

        // Check counting numbers
        Check_Counting_Numbers();
    }